

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O1

void __thiscall CPU::CPX_ZP(CPU *this)

{
  uint uVar1;
  int iVar2;
  byte bVar3;
  
  this->cycles = 3;
  uVar1 = (*this->memory->_vptr_MemoryBus[2])(this->memory,(ulong)this->pc);
  this->pc = this->pc + 1;
  this->cycles = this->cycles - 2;
  iVar2 = (*this->memory->_vptr_MemoryBus[2])(this->memory,(ulong)(uVar1 & 0xff));
  bVar3 = this->X - (byte)iVar2;
  (this->field_6).ps =
       bVar3 & 0x80 | (bVar3 == 0) * '\x02' | (byte)iVar2 <= this->X | (this->field_6).ps & 0x7c;
  return;
}

Assistant:

void CPU::CPX_ZP()
{
    cycles = 3;
    uint8_t op = ReadByte(GetByte());
    uint8_t res = X - op;
    C = (X >= op);
    Z = (X == op);
    N = (res & 0b10000000) > 0;
}